

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

bool __thiscall Refal2::CArbitraryInteger::SetValueByText(CArbitraryInteger *this,string *text)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference pcVar4;
  CArbitraryInteger local_d8;
  CArbitraryInteger local_b8;
  TDigit local_94;
  undefined1 local_90 [4];
  TDigit decimal;
  CArbitraryInteger local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_38;
  undefined4 local_34;
  int decimalCount;
  TDigit maxDecimal;
  int maxDecimalDigits;
  TDigit digit;
  const_iterator c;
  string *text_local;
  CArbitraryInteger *this_local;
  
  c._M_current = (char *)text;
  Zero(this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    return true;
  }
  _maxDecimalDigits = (char *)std::__cxx11::string::cbegin();
  pcVar4 = __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&maxDecimalDigits);
  if ((*pcVar4 == '-') ||
     (pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&maxDecimalDigits), *pcVar4 == '+')) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&maxDecimalDigits);
    SetSign(this,*pcVar4 == '-');
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&maxDecimalDigits);
  }
  maxDecimal = 0;
  decimalCount = 7;
  local_34 = 10000000;
  local_38 = 0;
  while( true ) {
    local_40._M_current = (char *)std::__cxx11::string::cend();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&maxDecimalDigits,&local_40);
    if (!bVar1) {
      local_94 = 1;
      for (; 0 < local_38; local_38 = local_38 + -1) {
        local_94 = local_94 * 10;
      }
      CArbitraryInteger(&local_b8,local_94);
      mul(this,&local_b8);
      ~CArbitraryInteger(&local_b8);
      CArbitraryInteger(&local_d8,maxDecimal);
      add(this,&local_d8);
      ~CArbitraryInteger(&local_d8);
      return true;
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&maxDecimalDigits);
    if ((*pcVar4 < '0') ||
       (pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&maxDecimalDigits), '9' < *pcVar4)) break;
    iVar2 = maxDecimal * 10;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&maxDecimalDigits);
    maxDecimal = iVar2 + *pcVar4 + -0x30;
    local_38 = local_38 + 1;
    if (local_38 == 7) {
      CArbitraryInteger(&local_60,10000000);
      mul(this,&local_60);
      ~CArbitraryInteger(&local_60);
      CArbitraryInteger((CArbitraryInteger *)local_90,maxDecimal);
      add(this,(CArbitraryInteger *)local_90);
      ~CArbitraryInteger((CArbitraryInteger *)local_90);
      maxDecimal = 0;
      local_38 = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&maxDecimalDigits);
  }
  Zero(this);
  return false;
}

Assistant:

bool CArbitraryInteger::SetValueByText( const std::string& text )
{
	Zero();
	if( text.empty() ) {
		return true;
	}
	std::string::const_iterator c = text.cbegin();
	if( *c == '-' || *c == '+' ) {
		SetSign( *c == '-' );
		++c;
	}
	TDigit digit = 0;
	const int maxDecimalDigits = 7;
	const TDigit maxDecimal = 10000000;
	static_assert( Base > maxDecimal, "too small Base" );
	int decimalCount = 0;
	for( ; c != text.cend(); ++c ) {
		if( *c >= '0' && *c <= '9' ) {
			digit = digit * 10 + ( *c - '0' );
			decimalCount++;
			if( decimalCount == maxDecimalDigits ) {
				mul( CArbitraryInteger( maxDecimal ) );
				add( CArbitraryInteger( digit ) );
				digit = 0;
				decimalCount = 0;
			}
		} else {
			Zero();
			return false;
		}
	}
	TDigit decimal = 1;
	for( ; decimalCount > 0; decimalCount-- ) {
		decimal *= 10;
	}
	mul( CArbitraryInteger( decimal ) );
	add( CArbitraryInteger( digit ) );
	return true;
}